

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue,uint useLowProbCount)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ushort uVar10;
  short *psVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  size_t sVar18;
  bool bVar19;
  uint local_48;
  
  uVar16 = 0xb;
  if (tableLog != 0) {
    uVar16 = tableLog;
  }
  bVar2 = (byte)uVar16;
  sVar18 = 0xffffffffffffffff;
  if (4 < uVar16) {
    if (uVar16 < 0xd) {
      uVar7 = FSE_minTableLog(total,maxSymbolValue);
      if (uVar7 <= uVar16) {
        uVar5 = -(ushort)(useLowProbCount != 0) | 1;
        cVar4 = -bVar2;
        bVar3 = cVar4 + 0x3e;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = total & 0xffffffff;
        uVar8 = 1 << (bVar2 & 0x1f);
        sVar18 = (size_t)uVar16;
        uVar7 = 0;
        uVar9 = 0;
        uVar16 = uVar8;
        for (uVar12 = 0; local_48 = (uint)(total >> (bVar2 & 0x3f)), uVar12 <= maxSymbolValue;
            uVar12 = uVar12 + 1) {
          uVar14 = (ulong)count[uVar12];
          if (uVar14 == total) {
            return 0;
          }
          if (uVar14 == 0) {
            normalizedCounter[uVar12] = 0;
          }
          else if (local_48 < count[uVar12]) {
            uVar14 = uVar14 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
            uVar15 = uVar14 >> (bVar3 & 0x3f);
            if ((uVar15 & 0xfff8) == 0) {
              uVar15 = (ulong)((int)uVar15 +
                              (uint)((ulong)FSE_normalizeCount::rtbTable[uVar15 & 0xffff] <<
                                     (cVar4 + 0x2aU & 0x3f) <
                                    uVar14 - ((uVar15 & 0xffff) << (bVar3 & 0x3f))));
            }
            uVar10 = (ushort)uVar15;
            if ((ushort)uVar9 < uVar10) {
              uVar7 = uVar12;
            }
            if ((ushort)uVar9 < uVar10) {
              uVar9 = uVar15 & 0xffff;
            }
            normalizedCounter[uVar12] = uVar10;
            uVar16 = uVar16 - (int)(uVar15 & 0xffff);
          }
          else {
            normalizedCounter[uVar12] = uVar5;
            uVar16 = uVar16 - 1;
          }
        }
        sVar6 = normalizedCounter[uVar7];
        iVar13 = (int)sVar6 >> 1;
        if (iVar13 == -uVar16 || SBORROW4(iVar13,-uVar16) != (int)(iVar13 + uVar16) < 0) {
          uVar15 = total * 3 >> (bVar2 + 1 & 0x3f);
          uVar14 = (ulong)(maxSymbolValue + 1);
          uVar7 = 0;
          for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
            uVar16 = count[uVar9];
            if ((ulong)uVar16 == 0) {
              normalizedCounter[uVar9] = 0;
            }
            else {
              if (local_48 < uVar16) {
                if ((uint)uVar15 < uVar16) {
                  normalizedCounter[uVar9] = -2;
                  goto LAB_001700a6;
                }
                normalizedCounter[uVar9] = 1;
              }
              else {
                normalizedCounter[uVar9] = uVar5;
              }
              uVar7 = uVar7 + 1;
              total = total - uVar16;
            }
LAB_001700a6:
          }
          uVar16 = uVar8 - uVar7;
          if (uVar16 == 0) {
            return sVar18;
          }
          if ((uVar15 & 0xffffffff) < total / uVar16) {
            uVar9 = total * 3;
            for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
              if ((normalizedCounter[uVar15] == -2) &&
                 (uVar12 = count[uVar15], uVar12 <= (uint)(uVar9 / (uVar16 * 2)))) {
                normalizedCounter[uVar15] = 1;
                uVar7 = uVar7 + 1;
                total = total - uVar12;
              }
            }
            uVar16 = uVar8 - uVar7;
          }
          if (uVar7 != maxSymbolValue + 1) {
            if (total == 0) {
              uVar7 = 0;
              while (uVar16 != 0) {
                if (0 < normalizedCounter[uVar7]) {
                  uVar16 = uVar16 - 1;
                  normalizedCounter[uVar7] = normalizedCounter[uVar7] + 1;
                }
                bVar19 = uVar7 == maxSymbolValue;
                uVar7 = uVar7 + 1;
                if (bVar19) {
                  uVar7 = 0;
                }
              }
              return sVar18;
            }
            uVar14 = ~(-1L << (cVar4 + 0x3dU & 0x3f));
            uVar7 = 0;
            uVar9 = uVar14;
            do {
              if (maxSymbolValue < uVar7) {
                return sVar18;
              }
              uVar15 = uVar9;
              if (normalizedCounter[uVar7] == -2) {
                uVar15 = (ulong)count[uVar7] *
                         ((((ulong)uVar16 << (bVar3 & 0x3f)) + uVar14) / (total & 0xffffffff)) +
                         uVar9;
                uVar9 = uVar9 >> (bVar3 & 0x3f);
                uVar17 = uVar15 >> (bVar3 & 0x3f);
                if (uVar17 == uVar9) {
                  return 0xffffffffffffffff;
                }
                normalizedCounter[uVar7] = (short)uVar17 - (short)uVar9;
              }
              uVar7 = uVar7 + 1;
              uVar9 = uVar15;
            } while( true );
          }
          uVar9 = 0;
          uVar7 = 0;
          for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
            if (uVar7 < count[uVar15]) {
              uVar9 = uVar15 & 0xffffffff;
              uVar7 = count[uVar15];
            }
          }
          psVar11 = normalizedCounter + uVar9;
          sVar6 = *psVar11;
        }
        else {
          psVar11 = normalizedCounter + uVar7;
        }
        *psVar11 = sVar6 + (short)uVar16;
      }
    }
    else {
      sVar18 = 0xffffffffffffffd4;
    }
  }
  return sVar18;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue, unsigned useLowProbCount)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        short const lowProbCount = useLowProbCount ? -1 : 1;
        U64 const scale = 62 - tableLog;
        U64 const step = ZSTD_div64((U64)1<<62, (U32)total);   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = lowProbCount;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue, lowProbCount);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}